

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O3

int uv__idna_toascii_label(char *s,char *se,char **d,char *de)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  int iVar13;
  char *pcVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  char *local_60;
  int local_54;
  char *local_50;
  ulong local_48;
  char *local_40;
  char **local_38;
  
  uVar11 = 0;
  iVar17 = 0;
  local_60 = s;
  local_50 = de;
  local_40 = s;
  while( true ) {
    if (s <= se) {
      uVar6 = uv__utf8_decode1(&local_60,se);
      de = (char *)(ulong)uVar6;
      s = local_60;
    }
    iVar10 = (int)uVar11;
    if (se < s) break;
    if ((uint)de < 0x80) {
      uVar11 = (ulong)(iVar10 + 1);
    }
    else {
      if ((uint)de == 0xffffffff) {
        return -0x16;
      }
      iVar17 = iVar17 + 1;
    }
  }
  if (iVar17 != 0) {
    pcVar8 = *d;
    if (pcVar8 < local_50) {
      *d = pcVar8 + 1;
      *pcVar8 = 'x';
      pcVar8 = *d;
    }
    if (pcVar8 < local_50) {
      *d = pcVar8 + 1;
      *pcVar8 = 'n';
      pcVar8 = *d;
    }
    if (pcVar8 < local_50) {
      *d = pcVar8 + 1;
      *pcVar8 = '-';
      pcVar8 = *d;
    }
    if (pcVar8 < local_50) {
      *d = pcVar8 + 1;
      *pcVar8 = '-';
    }
  }
  local_60 = local_40;
  iVar13 = 0;
  pcVar8 = local_40;
  do {
    do {
      if (pcVar8 <= se) {
        uVar6 = uv__utf8_decode1(&local_60,se);
        de = (char *)(ulong)uVar6;
        pcVar8 = local_60;
      }
      if (se < pcVar8) goto LAB_00109a2f;
    } while (0x7f < (uint)de);
    pcVar14 = *d;
    if (pcVar14 < local_50) {
      *d = pcVar14 + 1;
      *pcVar14 = (char)de;
    }
    iVar13 = iVar13 + 1;
  } while (iVar13 != iVar10);
LAB_00109a2f:
  if (iVar17 != 0) {
    if ((iVar10 != 0) && (pcVar8 = *d, pcVar8 < local_50)) {
      *d = pcVar8 + 1;
      *pcVar8 = '-';
    }
    uVar6 = 0x80;
    uVar18 = 0x48;
    uVar15 = 0;
    local_54 = 1;
    local_48 = uVar11;
    local_38 = d;
    do {
      local_60 = local_40;
      pcVar8 = local_40;
      pcVar14 = (char *)0xffffffff;
      while( true ) {
        if (pcVar8 <= se) {
          uVar7 = uv__utf8_decode1(&local_60,se);
          de = (char *)(ulong)uVar7;
          pcVar8 = local_60;
        }
        pcVar12 = local_50;
        uVar7 = (uint)pcVar14;
        if (se < pcVar8) break;
        pcVar12 = pcVar14;
        if ((uint)de < uVar7) {
          pcVar12 = (char *)((ulong)de & 0xffffffff);
        }
        if (uVar6 <= (uint)de) {
          pcVar14 = pcVar12;
        }
      }
      uVar16 = (int)local_48 + 1;
      if (~uVar15 / uVar16 < uVar7 - uVar6) {
        return -7;
      }
      uVar15 = uVar15 + (uVar7 - uVar6) * uVar16;
      local_60 = local_40;
      pcVar8 = local_40;
      while( true ) {
        if (pcVar8 <= se) {
          uVar6 = uv__utf8_decode1(&local_60,se);
          de = (char *)(ulong)uVar6;
          pcVar8 = local_60;
        }
        if (se < pcVar8) break;
        if (((uint)de < uVar7) && (uVar15 = uVar15 + 1, uVar15 == 0)) {
          return -7;
        }
        if ((uint)de == uVar7) {
          uVar6 = -(uVar18 - 0x24);
          if (0x19 < -(uVar18 - 0x24)) {
            uVar6 = 0x1a;
          }
          uVar11 = (ulong)uVar6;
          if (0x23 < uVar18) {
            uVar11 = 1;
          }
          uVar6 = uVar15;
          if ((uint)uVar11 <= uVar15) {
            uVar16 = 0x48;
            uVar9 = (ulong)uVar15;
            do {
              uVar4 = (ulong)(0x24 - (int)uVar11);
              uVar5 = (ulong)(uint)((int)uVar9 - (int)uVar11);
              uVar9 = uVar5 / uVar4;
              uVar6 = (uint)uVar9;
              pcVar2 = *local_38;
              if (pcVar2 < pcVar12) {
                cVar1 = "abcdefghijklmnopqrstuvwxyz0123456789"[uVar11 + uVar5 % uVar4];
                *local_38 = pcVar2 + 1;
                *pcVar2 = cVar1;
              }
              uVar11 = (ulong)(uVar16 - uVar18);
              if (0x19 < uVar16 - uVar18) {
                uVar11 = 0x1a;
              }
              if (uVar16 <= uVar18) {
                uVar11 = 1;
              }
              uVar16 = uVar16 + 0x24;
            } while ((uint)uVar11 <= uVar6);
          }
          pcVar2 = *local_38;
          if (pcVar2 < pcVar12) {
            cVar1 = "abcdefghijklmnopqrstuvwxyz0123456789"[uVar6];
            *local_38 = pcVar2 + 1;
            *pcVar2 = cVar1;
          }
          uVar11 = (ulong)uVar15 / 700;
          if (local_54 == 0) {
            uVar11 = (ulong)(uVar15 >> 1);
          }
          local_48 = (ulong)((int)local_48 + 1);
          uVar15 = 0;
          uVar6 = (int)(uVar11 / local_48) + (int)uVar11;
          if (uVar6 < 0x1c8) {
            iVar10 = 0;
          }
          else {
            iVar10 = 0;
            uVar18 = uVar6;
            do {
              uVar6 = uVar18 / 0x23;
              iVar10 = iVar10 + 0x24;
              bVar3 = 0x3e57 < uVar18;
              uVar18 = uVar6;
            } while (bVar3);
          }
          uVar18 = (uVar6 * 0x24 & 0xffff) / (uVar6 + 0x26 & 0xffff) + iVar10;
          iVar17 = iVar17 + -1;
          local_54 = 0;
          de = pcVar14;
        }
      }
      uVar15 = uVar15 + 1;
      uVar6 = uVar7 + 1;
      iVar10 = 0;
    } while (iVar17 != 0);
  }
  return iVar10;
}

Assistant:

static int uv__idna_toascii_label(const char* s, const char* se,
                                  char** d, char* de) {
  static const char alphabet[] = "abcdefghijklmnopqrstuvwxyz0123456789";
  const char* ss;
  unsigned c;
  unsigned h;
  unsigned k;
  unsigned n;
  unsigned m;
  unsigned q;
  unsigned t;
  unsigned x;
  unsigned y;
  unsigned bias;
  unsigned delta;
  unsigned todo;
  int first;

  h = 0;
  ss = s;
  todo = 0;

  foreach_codepoint(c, &s, se) {
    if (c < 128)
      h++;
    else if (c == (unsigned) -1)
      return UV_EINVAL;
    else
      todo++;
  }

  if (todo > 0) {
    if (*d < de) *(*d)++ = 'x';
    if (*d < de) *(*d)++ = 'n';
    if (*d < de) *(*d)++ = '-';
    if (*d < de) *(*d)++ = '-';
  }

  x = 0;
  s = ss;
  foreach_codepoint(c, &s, se) {
    if (c > 127)
      continue;

    if (*d < de)
      *(*d)++ = c;

    if (++x == h)
      break;  /* Visited all ASCII characters. */
  }

  if (todo == 0)
    return h;

  /* Only write separator when we've written ASCII characters first. */
  if (h > 0)
    if (*d < de)
      *(*d)++ = '-';

  n = 128;
  bias = 72;
  delta = 0;
  first = 1;

  while (todo > 0) {
    m = -1;
    s = ss;
    foreach_codepoint(c, &s, se)
      if (c >= n)
        if (c < m)
          m = c;

    x = m - n;
    y = h + 1;

    if (x > ~delta / y)
      return UV_E2BIG;  /* Overflow. */

    delta += x * y;
    n = m;

    s = ss;
    foreach_codepoint(c, &s, se) {
      if (c < n)
        if (++delta == 0)
          return UV_E2BIG;  /* Overflow. */

      if (c != n)
        continue;

      for (k = 36, q = delta; /* empty */; k += 36) {
        t = 1;

        if (k > bias)
          t = k - bias;

        if (t > 26)
          t = 26;

        if (q < t)
          break;

        /* TODO(bnoordhuis) Since 1 <= t <= 26 and therefore
         * 10 <= y <= 35, we can optimize the long division
         * into a table-based reciprocal multiplication.
         */
        x = q - t;
        y = 36 - t;  /* 10 <= y <= 35 since 1 <= t <= 26. */
        q = x / y;
        t = t + x % y;  /* 1 <= t <= 35 because of y. */

        if (*d < de)
          *(*d)++ = alphabet[t];
      }

      if (*d < de)
        *(*d)++ = alphabet[q];

      delta /= 2;

      if (first) {
        delta /= 350;
        first = 0;
      }

      /* No overflow check is needed because |delta| was just
       * divided by 2 and |delta+delta >= delta + delta/h|.
       */
      h++;
      delta += delta / h;

      for (bias = 0; delta > 35 * 26 / 2; bias += 36)
        delta /= 35;

      bias += 36 * delta / (delta + 38);
      delta = 0;
      todo--;
    }

    delta++;
    n++;
  }

  return 0;
}